

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall Parser::parseNullCoalesce(Parser *this)

{
  int iVar1;
  Node *left;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int i;
  long lVar2;
  Node *n;
  vector<Node_*,_std::allocator<Node_*>_> nodes;
  vector<Token_*,_std::allocator<Token_*>_> opTokens;
  
  nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  opTokens.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  opTokens.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  opTokens.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  do {
    n = parseOr(this);
    if (n == (Node *)0x0) {
LAB_0011116b:
      if (nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        left = (Node *)0x0;
      }
      else {
        left = *nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
        if ((long)nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start != 8) {
          for (lVar2 = 1;
              lVar2 < (int)((ulong)((long)nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 3);
              lVar2 = lVar2 + 1) {
            left = createBinaryOpNode(this,opTokens.
                                           super__Vector_base<Token_*,_std::allocator<Token_*>_>.
                                           _M_impl.super__Vector_impl_data._M_start[lVar2 + -1],left
                                      ,nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start[lVar2]);
          }
        }
      }
      std::_Vector_base<Token_*,_std::allocator<Token_*>_>::~_Vector_base
                (&opTokens.super__Vector_base<Token_*,_std::allocator<Token_*>_>);
      std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
                (&nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
      return left;
    }
    iVar1 = accept(this,0x34,__addr,in_RCX);
    if ((char)iVar1 == '\0') {
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&nodes,&n);
      goto LAB_0011116b;
    }
    std::vector<Token_*,_std::allocator<Token_*>_>::push_back(&opTokens,&this->tok);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&nodes,&n);
  } while( true );
}

Assistant:

Node * parseTernaryOp()
  {
    Node * expr = parseNullCoalesce();
    if (!expr)
      return nullptr;

    if (!accept(TK_QMARK))
      return expr;

    Token & qmarkToken = *tok;

    Node * ifTrue = parseTernaryOp();
    if (!ifTrue)
    {
      ctx.error(121, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    if (!expect(TK_COLON))
    {
      ctx.error(122, (string("expected ':' but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * ifFalse = parseTernaryOp();
    if (!ifFalse)
    {
      ctx.error(123, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * res = createTernaryOpNode(qmarkToken, expr, ifTrue, ifFalse);
    return res;
  }